

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_addsubq(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i32 arg2;
  TCGTemp *a1;
  TCGv_i32 arg1;
  uint reg0;
  uintptr_t o;
  uint uVar2;
  uint val;
  int iVar3;
  uint32_t dest;
  int opsize;
  uintptr_t o_1;
  int mode;
  uint mode_00;
  uintptr_t o_3;
  TCGv_i32 addr;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar2 = insn & 0x38;
  opsize = 2;
  if (uVar2 != 8) {
    opsize = *(int *)(&DAT_00d886a4 + (insn >> 4 & 0xc));
  }
  mode_00 = insn >> 3 & 7;
  reg0 = insn & 7;
  pTVar1 = gen_ea_mode(env,s,mode_00,reg0,opsize,tcg_ctx->NULL_QREG,&addr,EA_LOADS,
                       (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 == tcg_ctx->NULL_QREG) {
    dest = (s->base).pc_next;
  }
  else {
    val = 8;
    if ((insn >> 9 & 7) != 0) {
      val = insn >> 9 & 7;
    }
    arg2 = tcg_const_i32_m68k(tcg_ctx,val);
    a1 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    arg1 = (TCGv_i32)((long)a1 - (long)tcg_ctx);
    if (pTVar1 != arg1) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)a1,(TCGArg)(pTVar1 + (long)tcg_ctx));
    }
    if (uVar2 == 8) {
      if ((insn >> 8 & 1) == 0) {
        tcg_gen_op3_m68k(tcg_ctx,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)a1,
                         (TCGArg)(arg2 + (long)&tcg_ctx->pool_cur));
      }
      else {
        tcg_gen_sub_i32(tcg_ctx,arg1,arg1,arg2);
      }
    }
    else {
      if ((insn >> 8 & 1) == 0) {
        tcg_gen_op3_m68k(tcg_ctx,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)a1,
                         (TCGArg)(arg2 + (long)&tcg_ctx->pool_cur));
        tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_LTU,QREG_CC_X,arg1,arg2);
        iVar3 = 2;
      }
      else {
        tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_LTU,QREG_CC_X,arg1,arg2);
        tcg_gen_sub_i32(tcg_ctx,arg1,arg1,arg2);
        iVar3 = 5;
      }
      set_cc_op(s,iVar3 + opsize);
      gen_update_cc_add(tcg_ctx,arg1,arg2,opsize);
    }
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
    pTVar1 = gen_ea_mode(env,s,mode_00,reg0,opsize,arg1,&addr,EA_STORE,
                         (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar1 != tcg_ctx->NULL_QREG) {
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
      return;
    }
    dest = (s->base).pc_next;
  }
  gen_exception(s,dest,3);
  return;
}

Assistant:

DISAS_INSN(addsubq)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv dest;
    TCGv val;
    int imm;
    TCGv addr;
    int opsize;

    if ((insn & 070) == 010) {
        /* Operation on address register is always long.  */
        opsize = OS_LONG;
    } else {
        opsize = insn_opsize(insn);
    }
    SRC_EA(env, src, opsize, 1, &addr);
    imm = (insn >> 9) & 7;
    if (imm == 0) {
        imm = 8;
    }
    val = tcg_const_i32(tcg_ctx, imm);
    dest = tcg_temp_new(tcg_ctx);
    tcg_gen_mov_i32(tcg_ctx, dest, src);
    if ((insn & 0x38) == 0x08) {
        /*
         * Don't update condition codes if the destination is an
         * address register.
         */
        if (insn & 0x0100) {
            tcg_gen_sub_i32(tcg_ctx, dest, dest, val);
        } else {
            tcg_gen_add_i32(tcg_ctx, dest, dest, val);
        }
    } else {
        if (insn & 0x0100) {
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, dest, val);
            tcg_gen_sub_i32(tcg_ctx, dest, dest, val);
            set_cc_op(s, CC_OP_SUBB + opsize);
        } else {
            tcg_gen_add_i32(tcg_ctx, dest, dest, val);
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, dest, val);
            set_cc_op(s, CC_OP_ADDB + opsize);
        }
        gen_update_cc_add(tcg_ctx, dest, val, opsize);
    }
    tcg_temp_free(tcg_ctx, val);
    DEST_EA(env, insn, opsize, dest, &addr);
    tcg_temp_free(tcg_ctx, dest);
}